

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzverysparsematrix.cpp
# Opt level: O0

void __thiscall
TPZVerySparseMatrix<long_double>::WriteMap
          (TPZVerySparseMatrix<long_double> *this,TPZStream *buf,int withclassid,
          map<std::pair<long,_long>,_long_double,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long_double>_>_>
          *TheMap)

{
  bool bVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_type sVar4;
  pointer ppVar5;
  map<std::pair<long,_long>,_long_double,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long_double>_>_>
  *in_RSI;
  int jj;
  int ii;
  const_iterator it;
  int mapsz;
  map<std::pair<long,_long>,_long_double,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long_double>_>_>
  *in_stack_ffffffffffffffa8;
  _Self in_stack_ffffffffffffffb0;
  int iVar6;
  _Self local_40;
  _Base_ptr local_38;
  _Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_long_double>_> local_30;
  undefined4 local_24 [5];
  map<std::pair<long,_long>,_long_double,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long_double>_>_>
  *local_10;
  
  local_10 = in_RSI;
  sVar4 = std::
          map<std::pair<long,_long>,_long_double,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long_double>_>_>
          ::size((map<std::pair<long,_long>,_long_double,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long_double>_>_>
                  *)0x1420ab1);
  local_24[0] = (undefined4)sVar4;
  (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,local_24,1);
  std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_long_double>_>::
  _Rb_tree_const_iterator(&local_30);
  local_38 = (_Base_ptr)
             std::
             map<std::pair<long,_long>,_long_double,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long_double>_>_>
             ::begin(in_stack_ffffffffffffffa8);
  local_30._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::pair<long,_long>,_long_double,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long_double>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar1 = std::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_long_double>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_long_double>_>
                         *)in_stack_ffffffffffffffb0._M_node);
    uVar2 = (undefined4)(ppVar5->first).first;
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_long_double>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_long_double>_>
                         *)in_stack_ffffffffffffffb0._M_node);
    uVar3 = (undefined4)(ppVar5->first).second;
    (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&stack0xffffffffffffffbc,1);
    (**(code **)(*(long *)&(local_10->_M_t)._M_impl + 0x18))(local_10,&stack0xffffffffffffffb8,1);
    in_stack_ffffffffffffffa8 = local_10;
    ppVar5 = std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_long_double>_>::
             operator->((_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_long_double>_>
                         *)in_stack_ffffffffffffffb0._M_node);
    iVar6 = (int)((ulong)in_stack_ffffffffffffffb0._M_node >> 0x20);
    (**(code **)(*(long *)&(in_stack_ffffffffffffffa8->_M_t)._M_impl + 0x48))
              (in_stack_ffffffffffffffa8,&ppVar5->second,1);
    in_stack_ffffffffffffffb0 =
         std::_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_long_double>_>::
         operator++((_Rb_tree_const_iterator<std::pair<const_std::pair<long,_long>,_long_double>_> *
                    )CONCAT44(uVar2,uVar3),iVar6);
  }
  return;
}

Assistant:

void TPZVerySparseMatrix<TVar>::WriteMap(TPZStream &buf, int withclassid, const std::map<std::pair<int64_t, int64_t>, TVar> & TheMap) const
{
	int mapsz = TheMap.size();
	buf.Write(&mapsz, 1);
	typename std::map<std::pair<int64_t, int64_t>, TVar>::const_iterator it;
	for(it = TheMap.begin(); it != TheMap.end(); it++)
	{
		int ii = 0, jj = 0;
		ii = it->first.first;
		jj = it->first.second;
		buf.Write(&ii, 1);
		buf.Write(&jj, 1);
		buf.Write(&it->second, 1);
	}
}